

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O0

void __thiscall Updater::~Updater(Updater *this)

{
  Updater *this_local;
  
  *(undefined ***)this = &PTR_metaObject_0012b500;
  if (this->m_downloader != (Downloader *)0x0) {
    (**(code **)(*(long *)this->m_downloader + 0x20))();
  }
  QString::~QString(&this->m_downloadPassword);
  QString::~QString(&this->m_downloadUserName);
  QString::~QString(&this->m_latestVersion);
  QString::~QString(&this->m_moduleVersion);
  QString::~QString(&this->m_downloadUrl);
  QString::~QString(&this->m_moduleName);
  QString::~QString(&this->m_changelog);
  QString::~QString(&this->m_platform);
  QString::~QString(&this->m_openUrl);
  QString::~QString(&this->m_userAgentString);
  QString::~QString(&this->m_url);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

Updater::~Updater()
{
   delete m_downloader;
}